

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.cpp
# Opt level: O1

bool duckdb::TryMultiplyOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
               (uint64_t left,uint64_t right,uint64_t *result)

{
  uint64_t uVar1;
  ulong uVar2;
  uint64_t uVar3;
  
  uVar3 = right;
  if (right < left) {
    uVar3 = left;
  }
  uVar1 = right;
  if (left < right) {
    uVar1 = left;
  }
  if (((uVar1 >> 0x20 == 0) && (uVar2 = (uVar3 >> 0x20) * uVar1, uVar2 >> 0x20 == 0)) &&
     (!CARRY8(uVar2 << 0x20,(uVar3 & 0xffffffff) * uVar1))) {
    *result = right * left;
    return true;
  }
  return false;
}

Assistant:

bool TryMultiplyOperator::Operation(uint64_t left, uint64_t right, uint64_t &result) {
	if (left > right) {
		std::swap(left, right);
	}
	if (left > NumericLimits<uint32_t>::Maximum()) {
		return false;
	}
	uint32_t c = right >> 32;
	uint32_t d = NumericLimits<uint32_t>::Maximum() & right;
	uint64_t r = left * c;
	uint64_t s = left * d;
	if (r > NumericLimits<uint32_t>::Maximum()) {
		return false;
	}
	r <<= 32;
	if (NumericLimits<uint64_t>::Maximum() - s < r) {
		return false;
	}
	return OverflowCheckedMultiply::Operation<uint64_t, uint64_t>(left, right, result);
}